

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O0

void __thiscall
SQNativeClosure::SQNativeClosure(SQNativeClosure *this,SQSharedState *ss,SQFUNCTION func)

{
  SQUnsignedInteger in_RDX;
  SQSharedState *in_RSI;
  SQCollectable_conflict *in_RDI;
  SQCollectable *in_stack_ffffffffffffffc0;
  
  SQCollectable::SQCollectable(in_stack_ffffffffffffffc0);
  (in_RDI->super_SQRefCounted)._vptr_SQRefCounted = (_func_int **)&PTR__SQNativeClosure_001547e8;
  sqvector<long_long>::sqvector((sqvector<long_long> *)&in_RDI[1].super_SQRefCounted._uiRef);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&in_RDI[2].super_SQRefCounted._weakref);
  in_RDI[2].super_SQRefCounted._uiRef = in_RDX;
  in_RDI->_next = (SQCollectable_conflict *)0x0;
  in_RDI->_prev = (SQCollectable_conflict *)0x0;
  in_RDI->_sharedstate = in_RSI;
  SQCollectable::AddToChain(&in_RDI->_sharedstate->_gc_chain,in_RDI);
  in_RDI[2].super_SQRefCounted._vptr_SQRefCounted = (_func_int **)0x0;
  return;
}

Assistant:

SQNativeClosure(SQSharedState *ss,SQFUNCTION func){_function=func;INIT_CHAIN();ADD_TO_CHAIN(&_ss(this)->_gc_chain,this); _env = NULL;}